

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFastExtract(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint local_a4;
  int nPairsLimit;
  int fNewAlgo;
  int c;
  Fxu_Data_t *p;
  Fxu_Data_t Params;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Params._88_8_ = Abc_FrameReadNtk(pAbc);
  bVar1 = true;
  local_a4 = 1000000000;
  Abc_NtkSetDefaultFxParams((Fxu_Data_t *)&p);
  Extra_UtilGetoptReset();
LAB_00266ad8:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"SDNWMPsdzcnxvwh");
    if (iVar2 == -1) {
      if (Params._88_8_ == 0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar2 = Abc_NtkNodeNum((Abc_Ntk_t *)Params._88_8_);
      if ((iVar2 == 0) || (iVar2 = Abc_NtkPiNum((Abc_Ntk_t *)Params._88_8_), iVar2 == 0)) {
        Abc_Print(0,"The network does not have internal nodes.\n");
        return 0;
      }
      iVar2 = Abc_NtkIsLogic((Abc_Ntk_t *)Params._88_8_);
      if (iVar2 == 0) {
        Abc_Print(-1,
                  "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n"
                 );
        return 1;
      }
      iVar2 = Abc_NtkIsSopLogic((Abc_Ntk_t *)Params._88_8_);
      if (iVar2 == 0) {
        Abc_Print(-1,
                  "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n"
                 );
        return 1;
      }
      iVar2 = Abc_NtkGetCubePairNum((Abc_Ntk_t *)Params._88_8_);
      if ((int)local_a4 < iVar2) {
        Abc_Print(-1,"Cannot perform \"fx\" because the number cube pairs exceeds the limit (%d).\n"
                  ,(ulong)local_a4);
        return 1;
      }
      if (bVar1) {
        Abc_NtkFxPerform((Abc_Ntk_t *)Params._88_8_,Params.fVerbose,Params.nPairsMax,
                         Params.WeightMin,Params.fUse0,Params.fUseCompl);
      }
      else {
        Abc_NtkFastExtract((Abc_Ntk_t *)Params._88_8_,(Fxu_Data_t *)&p);
      }
      Abc_NtkFxuFreeInfo((Fxu_Data_t *)&p);
      return 0;
    }
    switch(iVar2) {
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_00266fdd;
      }
      Params.nNodesExt = atoi(argv[globalUtilOptind]);
      uVar3 = Params.nNodesExt;
      break;
    default:
      goto LAB_00266fdd;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_00266fdd;
      }
      Params.nPairsMax = atoi(argv[globalUtilOptind]);
      uVar3 = Params.nPairsMax;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_00266fdd;
      }
      Params.fVerbose = atoi(argv[globalUtilOptind]);
      uVar3 = Params.fVerbose;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_00266fdd;
      }
      local_a4 = atoi(argv[globalUtilOptind]);
      uVar3 = local_a4;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by an integer.\n");
        goto LAB_00266fdd;
      }
      Params.fVeryVerbose = atoi(argv[globalUtilOptind]);
      uVar3 = Params.fVeryVerbose;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_00266fdd;
      }
      Params.nSingleMax = atoi(argv[globalUtilOptind]);
      uVar3 = Params.nSingleMax;
      break;
    case 99:
      Params.fOnlyD = Params.fOnlyD ^ 1;
      goto LAB_00266ad8;
    case 100:
      p._4_4_ = p._4_4_ ^ 1;
      goto LAB_00266ad8;
    case 0x68:
      goto LAB_00266fdd;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_00266ad8;
    case 0x73:
      p._0_4_ = (uint)p ^ 1;
      goto LAB_00266ad8;
    case 0x76:
      Params.fUse0 = Params.fUse0 ^ 1;
      goto LAB_00266ad8;
    case 0x77:
      Params.fUseCompl = Params.fUseCompl ^ 1;
      goto LAB_00266ad8;
    case 0x78:
      Params.WeightMin = Params.WeightMin ^ 1;
      goto LAB_00266ad8;
    case 0x7a:
      Params.fOnlyS = Params.fOnlyS ^ 1;
      goto LAB_00266ad8;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar3 < 0) {
LAB_00266fdd:
      Abc_Print(-2,"usage: fx [-SDNWMP <num>] [-sdzcnxvwh]\n");
      Abc_Print(-2,"\t           performs unate fast extract on the current network\n");
      Abc_Print(-2,"\t-S <num> : max number of single-cube divisors to consider [default = %d]\n",
                (ulong)(uint)Params.fVeryVerbose);
      Abc_Print(-2,"\t-D <num> : max number of double-cube divisors to consider [default = %d]\n",
                (ulong)(uint)Params.nNodesExt);
      Abc_Print(-2,"\t-N <num> : max number of divisors to extract during this run [default = %d]\n"
                ,(ulong)(uint)Params.fVerbose);
      Abc_Print(-2,"\t-W <num> : lower bound on the weight of divisors to extract [default = %d]\n",
                (ulong)(uint)Params.nSingleMax);
      Abc_Print(-2,
                "\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n",
                (ulong)(uint)Params.nPairsMax);
      Abc_Print(-2,"\t-P <num> : skip \"fx\" if cube pair count exceeds this limit [default = %d]\n"
                ,(ulong)local_a4);
      pcVar4 = "no";
      if ((uint)p != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s       : use only single-cube divisors [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (p._4_4_ != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-d       : use only double-cube divisors [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fOnlyS != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-z       : use zero-weight divisors [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fOnlyD != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-c       : use complement in the binary case [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (bVar1) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-n       : use new implementation of fast extract [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.WeightMin != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-x       : use only canonical divisors (AND, XOR, MUX) [default = %s]\n",
                pcVar4);
      pcVar4 = "no";
      if (Params.fUse0 != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Params.fUseCompl != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-w       : print additional information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandFastExtract( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkFxPerform( Abc_Ntk_t * pNtk, int nNewNodesMax, int nLitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Fxu_Data_t Params, * p = &Params;
    int c, fNewAlgo = 1;
    int nPairsLimit = 1000000000;
    // set the defaults
    Abc_NtkSetDefaultFxParams( p );
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "SDNWMPsdzcnxvwh")) != EOF )
    {
        switch (c)
        {
            case 'S':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->nSingleMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->nSingleMax < 0 )
                    goto usage;
                break;
            case 'D':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->nPairsMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->nPairsMax < 0 )
                    goto usage;
                break;
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->nNodesExt = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->nNodesExt < 0 )
                    goto usage;
                break;
            case 'W':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->WeightMin = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->WeightMin < 0 )
                    goto usage;
                break;
            case 'M':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                    goto usage;
                }
                p->LitCountMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( p->LitCountMax < 0 )
                    goto usage;
                break;
            case 'P':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                    goto usage;
                }
                nPairsLimit = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nPairsLimit < 0 )
                    goto usage;
                break;
            case 's':
                p->fOnlyS ^= 1;
                break;
            case 'd':
                p->fOnlyD ^= 1;
                break;
            case 'z':
                p->fUse0 ^= 1;
                break;
            case 'c':
                p->fUseCompl ^= 1;
                break;
            case 'n':
                fNewAlgo ^= 1;
                break;
            case 'x':
                p->fCanonDivs ^= 1;
                break;
            case 'v':
                p->fVerbose ^= 1;
                break;
            case 'w':
                p->fVeryVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkNodeNum(pNtk) == 0 || Abc_NtkPiNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The network does not have internal nodes.\n" );
        return 0;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n" );
        return 1;
    }
    if ( Abc_NtkGetCubePairNum(pNtk) > nPairsLimit )
    {
        Abc_Print( -1, "Cannot perform \"fx\" because the number cube pairs exceeds the limit (%d).\n", nPairsLimit );
        return 1;
    }

    // the nodes to be merged are linked into the special linked list
    if ( fNewAlgo )
        Abc_NtkFxPerform( pNtk, p->nNodesExt, p->LitCountMax, p->fCanonDivs, p->fVerbose, p->fVeryVerbose );
    else
        Abc_NtkFastExtract( pNtk, p );
    Abc_NtkFxuFreeInfo( p );
    return 0;

usage:
    Abc_Print( -2, "usage: fx [-SDNWMP <num>] [-sdzcnxvwh]\n");
    Abc_Print( -2, "\t           performs unate fast extract on the current network\n");
    Abc_Print( -2, "\t-S <num> : max number of single-cube divisors to consider [default = %d]\n", p->nSingleMax );
    Abc_Print( -2, "\t-D <num> : max number of double-cube divisors to consider [default = %d]\n", p->nPairsMax );
    Abc_Print( -2, "\t-N <num> : max number of divisors to extract during this run [default = %d]\n", p->nNodesExt );
    Abc_Print( -2, "\t-W <num> : lower bound on the weight of divisors to extract [default = %d]\n", p->WeightMin );
    Abc_Print( -2, "\t-M <num> : upper bound on literal count of divisors to extract [default = %d]\n", p->LitCountMax );
    Abc_Print( -2, "\t-P <num> : skip \"fx\" if cube pair count exceeds this limit [default = %d]\n", nPairsLimit );
    Abc_Print( -2, "\t-s       : use only single-cube divisors [default = %s]\n", p->fOnlyS? "yes": "no" );
    Abc_Print( -2, "\t-d       : use only double-cube divisors [default = %s]\n", p->fOnlyD? "yes": "no" );
    Abc_Print( -2, "\t-z       : use zero-weight divisors [default = %s]\n", p->fUse0? "yes": "no" );
    Abc_Print( -2, "\t-c       : use complement in the binary case [default = %s]\n", p->fUseCompl? "yes": "no" );
    Abc_Print( -2, "\t-n       : use new implementation of fast extract [default = %s]\n", fNewAlgo? "yes": "no" );
    Abc_Print( -2, "\t-x       : use only canonical divisors (AND, XOR, MUX) [default = %s]\n", p->fCanonDivs? "yes": "no" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", p->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : print additional information [default = %s]\n", p->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}